

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O2

bool __thiscall Environment::IsMacro(Environment *this,size_t symbol)

{
  iterator iVar1;
  __normal_iterator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_*,_std::vector<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>_>
  __tmp;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  size_t local_28;
  size_t symbol_local;
  
  this_00 = &((this->slot_map).
              super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  local_28 = symbol;
  do {
    if (this_00 ==
        &((this->slot_map).
          super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_h) {
      return false;
    }
    this_00 = this_00 + -1;
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,&local_28);
  } while (iVar1.
           super__Node_iterator_base<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_false>
           ._M_cur == (__node_type *)0x0);
  return (bool)*(undefined1 *)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_false>
                       ._M_cur + 0x18);
}

Assistant:

bool Environment::IsMacro(size_t symbol) {
  for (auto it = slot_map.rbegin(); it != slot_map.rend(); it++) {
    auto entry = it->find(symbol);
    if (entry != it->end()) {
      return std::get<0>(entry->second);
    }
  }

  // this can happen if we're referencing a unbound identifier.
  // we'll emit an error later. just return false.
  return false;
}